

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLSchemaDescriptionImpl.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::XMLSchemaDescriptionImpl::XMLSchemaDescriptionImpl
          (XMLSchemaDescriptionImpl *this,MemoryManager *memMgr)

{
  XMLSchemaDescription::XMLSchemaDescription(&this->super_XMLSchemaDescription,memMgr);
  (this->super_XMLSchemaDescription).super_XMLGrammarDescription.super_XSerializable.
  _vptr_XSerializable = (_func_int **)&PTR__XMLSchemaDescriptionImpl_0041c3e0;
  this->fContextType = CONTEXT_UNKNOWN;
  this->fNamespace = (XMLCh *)0x0;
  this->fLocationHints = (RefArrayVectorOf<char16_t> *)0x0;
  this->fTriggeringComponent = (QName *)0x0;
  this->fEnclosingElementName = (QName *)0x0;
  this->fAttributes = (XMLAttDef *)0x0;
  return;
}

Assistant:

XMLSchemaDescriptionImpl::XMLSchemaDescriptionImpl(MemoryManager* const memMgr)
:XMLSchemaDescription(memMgr)
,fContextType(CONTEXT_UNKNOWN)
,fNamespace(0)
,fLocationHints(0)
,fTriggeringComponent(0)
,fEnclosingElementName(0)
,fAttributes(0) 
{
}